

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall
QList<QPointer<QMdiSubWindow>_>::move
          (QList<QPointer<QMdiSubWindow>_> *this,qsizetype from,qsizetype to)

{
  QPointer<QMdiSubWindow> *pQVar1;
  long lVar2;
  QPointer<QMdiSubWindow> *pQVar3;
  long lVar4;
  
  if (from == to) {
    return;
  }
  detach(this);
  pQVar1 = (this->d).ptr;
  if (from < to) {
    lVar4 = from * 0x10;
    pQVar3 = pQVar1 + from + 1;
    lVar2 = to << 4;
  }
  else {
    lVar4 = to * 0x10;
    lVar2 = from * 0x10;
    pQVar3 = pQVar1 + from;
  }
  std::_V2::__rotate<QPointer<QMdiSubWindow>*>
            ((long)&(pQVar1->wp).d + lVar4,pQVar3,(long)&pQVar1[1].wp.d + lVar2);
  return;
}

Assistant:

void move(qsizetype from, qsizetype to)
    {
        Q_ASSERT_X(from >= 0 && from < size(), "QList::move(qsizetype, qsizetype)", "'from' is out-of-range");
        Q_ASSERT_X(to >= 0 && to < size(), "QList::move(qsizetype, qsizetype)", "'to' is out-of-range");
        if (from == to) // don't detach when no-op
            return;
        detach();
        T * const b = d->begin();
        if (from < to)
            std::rotate(b + from, b + from + 1, b + to + 1);
        else
            std::rotate(b + to, b + from, b + from + 1);
    }